

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::UnsafeArenaSwap(Reflection *this,Message *lhs,Message *rhs)

{
  Nullable<const_char_*> failure_msg;
  LogMessageFatal local_30;
  Arena *local_20;
  
  local_30.super_LogMessage._0_8_ = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((local_30.super_LogMessage._0_8_ & 1) != 0) {
    local_30.super_LogMessage._0_8_ =
         *(ulong *)(local_30.super_LogMessage._0_8_ & 0xfffffffffffffffe);
  }
  local_20 = (Arena *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)local_20 & 1) != 0) {
    local_20 = *(Arena **)((ulong)local_20 & 0xfffffffffffffffe);
  }
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::Arena*,google::protobuf::Arena*>
                          ((Arena **)&local_30,&local_20,"lhs->GetArena() == rhs->GetArena()");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    InternalSwap(this,lhs,rhs);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0x4fd,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

void Reflection::UnsafeArenaSwap(Message* lhs, Message* rhs) const {
  ABSL_DCHECK_EQ(lhs->GetArena(), rhs->GetArena());
  InternalSwap(lhs, rhs);
}